

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DragBehavior(ImGuiID id,ImGuiDataType data_type,void *p_v,float v_speed,void *p_min,
                        void *p_max,char *format,ImGuiSliderFlags flags)

{
  char cVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  longlong v_max;
  unsigned_long_long v_max_00;
  int iVar6;
  uint uVar7;
  unsigned_long_long v_min;
  longlong v_min_00;
  float v_min_01;
  double v_min_02;
  float v_max_01;
  double v_max_02;
  ImS32 v32;
  uint local_44;
  uint local_40;
  float local_3c;
  double *local_38;
  
  pIVar2 = GImGui;
  if (flags != 1 && (flags & 0x7000000fU) != 0) {
    __assert_fail("(flags == 1 || (flags & ImGuiSliderFlags_InvalidMask_) == 0) && \"Invalid ImGuiSliderFlags flags! Has the \'float power\' argument been mistakenly cast to flags? Call function with ImGuiSliderFlags_Logarithmic flags instead.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                  ,0x8bd,
                  "bool ImGui::DragBehavior(ImGuiID, ImGuiDataType, void *, float, const void *, const void *, const char *, ImGuiSliderFlags)"
                 );
  }
  if (GImGui->ActiveId == id) {
    if (GImGui->ActiveIdSource == ImGuiInputSource_Nav) {
      if (GImGui->NavActivatePressedId == id) {
        cVar1 = GImGui->ActiveIdIsJustActivated;
        goto joined_r0x0016c123;
      }
    }
    else if (GImGui->ActiveIdSource == ImGuiInputSource_Mouse) {
      cVar1 = (GImGui->IO).MouseDown[0];
joined_r0x0016c123:
      if (cVar1 == '\0') {
        local_40 = flags;
        local_3c = v_speed;
        local_38 = (double *)p_v;
        ClearActiveID();
        p_v = local_38;
        flags = local_40;
        v_speed = local_3c;
      }
    }
  }
  if ((pIVar2->ActiveId != id) ||
     ((flags & 0x200000U) != 0 || ((pIVar2->CurrentWindow->DC).ItemFlags & 0x80U) != 0)) {
    return false;
  }
  switch(data_type) {
  case 0:
    local_44 = (uint)*p_v;
    if (p_min == (void *)0x0) {
      iVar6 = -0x80;
    }
    else {
      iVar6 = (int)*p_min;
    }
    if (p_max == (void *)0x0) {
      iVar4 = 0x7f;
    }
    else {
      iVar4 = (int)*p_max;
    }
    bVar3 = DragBehaviorT<int,int,float>(4,(int *)&local_44,v_speed,iVar6,iVar4,format,flags);
    break;
  case 1:
    local_44 = (uint)*p_v;
    if (p_min == (void *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = (uint)*p_min;
    }
    if (p_max == (void *)0x0) {
      uVar5 = 0xff;
    }
    else {
      uVar5 = (uint)*p_max;
    }
    bVar3 = DragBehaviorT<unsigned_int,int,float>(5,&local_44,v_speed,uVar7,uVar5,format,flags);
    break;
  case 2:
    local_44 = (uint)*p_v;
    if (p_min == (void *)0x0) {
      iVar6 = -0x8000;
    }
    else {
      iVar6 = (int)*p_min;
    }
    if (p_max == (void *)0x0) {
      iVar4 = 0x7fff;
    }
    else {
      iVar4 = (int)*p_max;
    }
    bVar3 = DragBehaviorT<int,int,float>(4,(int *)&local_44,v_speed,iVar6,iVar4,format,flags);
    goto LAB_0016c352;
  case 3:
    local_44 = (uint)*p_v;
    if (p_min == (void *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = (uint)*p_min;
    }
    if (p_max == (void *)0x0) {
      uVar5 = 0xffff;
    }
    else {
      uVar5 = (uint)*p_max;
    }
    bVar3 = DragBehaviorT<unsigned_int,int,float>(5,&local_44,v_speed,uVar7,uVar5,format,flags);
LAB_0016c352:
    if (bVar3 == false) {
      return false;
    }
    *(undefined2 *)p_v = (undefined2)local_44;
    return bVar3;
  case 4:
    if (p_min == (void *)0x0) {
      iVar6 = -0x80000000;
    }
    else {
      iVar6 = *p_min;
    }
    if (p_max == (void *)0x0) {
      iVar4 = 0x7fffffff;
    }
    else {
      iVar4 = *p_max;
    }
    bVar3 = DragBehaviorT<int,int,float>(4,(int *)p_v,v_speed,iVar6,iVar4,format,flags);
    return bVar3;
  case 5:
    if (p_min == (void *)0x0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *p_min;
    }
    if (p_max == (void *)0x0) {
      uVar5 = 0xffffffff;
    }
    else {
      uVar5 = *p_max;
    }
    bVar3 = DragBehaviorT<unsigned_int,int,float>(5,(uint *)p_v,v_speed,uVar7,uVar5,format,flags);
    return bVar3;
  case 6:
    v_max = 0x7fffffffffffffff;
    if (p_min == (void *)0x0) {
      v_min_00 = -0x8000000000000000;
    }
    else {
      v_min_00 = *p_min;
    }
    if (p_max != (void *)0x0) {
      v_max = *p_max;
    }
    bVar3 = DragBehaviorT<long_long,long_long,double>
                      (6,(longlong *)p_v,v_speed,v_min_00,v_max,format,flags);
    return bVar3;
  case 7:
    if (p_min == (void *)0x0) {
      v_min = 0;
    }
    else {
      v_min = *p_min;
    }
    if (p_max == (void *)0x0) {
      v_max_00 = 0xffffffffffffffff;
    }
    else {
      v_max_00 = *p_max;
    }
    bVar3 = DragBehaviorT<unsigned_long_long,long_long,double>
                      (7,(unsigned_long_long *)p_v,v_speed,v_min,v_max_00,format,flags);
    return bVar3;
  case 8:
    if (p_min == (void *)0x0) {
      v_min_01 = -3.4028235e+38;
    }
    else {
      v_min_01 = *p_min;
    }
    if (p_max == (void *)0x0) {
      v_max_01 = 3.4028235e+38;
    }
    else {
      v_max_01 = *p_max;
    }
    bVar3 = DragBehaviorT<float,float,float>(8,(float *)p_v,v_speed,v_min_01,v_max_01,format,flags);
    return bVar3;
  case 9:
    if (p_min == (void *)0x0) {
      v_min_02 = -1.79769313486232e+308;
    }
    else {
      v_min_02 = *p_min;
    }
    if (p_max == (void *)0x0) {
      v_max_02 = 1.79769313486232e+308;
    }
    else {
      v_max_02 = *p_max;
    }
    bVar3 = DragBehaviorT<double,double,double>
                      (9,(double *)p_v,v_speed,v_min_02,v_max_02,format,flags);
    return bVar3;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                  ,0x8da,
                  "bool ImGui::DragBehavior(ImGuiID, ImGuiDataType, void *, float, const void *, const void *, const char *, ImGuiSliderFlags)"
                 );
  }
  if (bVar3 != false) {
    *(undefined1 *)p_v = (undefined1)local_44;
  }
  return bVar3;
}

Assistant:

bool ImGui::DragBehavior(ImGuiID id, ImGuiDataType data_type, void* p_v, float v_speed, const void* p_min, const void* p_max, const char* format, ImGuiSliderFlags flags)
{
    // Read imgui.cpp "API BREAKING CHANGES" section for 1.78 if you hit this assert.
    IM_ASSERT((flags == 1 || (flags & ImGuiSliderFlags_InvalidMask_) == 0) && "Invalid ImGuiSliderFlags flags! Has the 'float power' argument been mistakenly cast to flags? Call function with ImGuiSliderFlags_Logarithmic flags instead.");

    ImGuiContext& g = *GImGui;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse && !g.IO.MouseDown[0])
            ClearActiveID();
        else if (g.ActiveIdSource == ImGuiInputSource_Nav && g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            ClearActiveID();
    }
    if (g.ActiveId != id)
        return false;
    if ((g.CurrentWindow->DC.ItemFlags & ImGuiItemFlags_ReadOnly) || (flags & ImGuiSliderFlags_ReadOnly))
        return false;

    switch (data_type)
    {
    case ImGuiDataType_S8:     { ImS32 v32 = (ImS32)*(ImS8*)p_v;  bool r = DragBehaviorT<ImS32, ImS32, float>(ImGuiDataType_S32, &v32, v_speed, p_min ? *(const ImS8*) p_min : IM_S8_MIN,  p_max ? *(const ImS8*)p_max  : IM_S8_MAX,  format, flags); if (r) *(ImS8*)p_v = (ImS8)v32; return r; }
    case ImGuiDataType_U8:     { ImU32 v32 = (ImU32)*(ImU8*)p_v;  bool r = DragBehaviorT<ImU32, ImS32, float>(ImGuiDataType_U32, &v32, v_speed, p_min ? *(const ImU8*) p_min : IM_U8_MIN,  p_max ? *(const ImU8*)p_max  : IM_U8_MAX,  format, flags); if (r) *(ImU8*)p_v = (ImU8)v32; return r; }
    case ImGuiDataType_S16:    { ImS32 v32 = (ImS32)*(ImS16*)p_v; bool r = DragBehaviorT<ImS32, ImS32, float>(ImGuiDataType_S32, &v32, v_speed, p_min ? *(const ImS16*)p_min : IM_S16_MIN, p_max ? *(const ImS16*)p_max : IM_S16_MAX, format, flags); if (r) *(ImS16*)p_v = (ImS16)v32; return r; }
    case ImGuiDataType_U16:    { ImU32 v32 = (ImU32)*(ImU16*)p_v; bool r = DragBehaviorT<ImU32, ImS32, float>(ImGuiDataType_U32, &v32, v_speed, p_min ? *(const ImU16*)p_min : IM_U16_MIN, p_max ? *(const ImU16*)p_max : IM_U16_MAX, format, flags); if (r) *(ImU16*)p_v = (ImU16)v32; return r; }
    case ImGuiDataType_S32:    return DragBehaviorT<ImS32, ImS32, float >(data_type, (ImS32*)p_v,  v_speed, p_min ? *(const ImS32* )p_min : IM_S32_MIN, p_max ? *(const ImS32* )p_max : IM_S32_MAX, format, flags);
    case ImGuiDataType_U32:    return DragBehaviorT<ImU32, ImS32, float >(data_type, (ImU32*)p_v,  v_speed, p_min ? *(const ImU32* )p_min : IM_U32_MIN, p_max ? *(const ImU32* )p_max : IM_U32_MAX, format, flags);
    case ImGuiDataType_S64:    return DragBehaviorT<ImS64, ImS64, double>(data_type, (ImS64*)p_v,  v_speed, p_min ? *(const ImS64* )p_min : IM_S64_MIN, p_max ? *(const ImS64* )p_max : IM_S64_MAX, format, flags);
    case ImGuiDataType_U64:    return DragBehaviorT<ImU64, ImS64, double>(data_type, (ImU64*)p_v,  v_speed, p_min ? *(const ImU64* )p_min : IM_U64_MIN, p_max ? *(const ImU64* )p_max : IM_U64_MAX, format, flags);
    case ImGuiDataType_Float:  return DragBehaviorT<float, float, float >(data_type, (float*)p_v,  v_speed, p_min ? *(const float* )p_min : -FLT_MAX,   p_max ? *(const float* )p_max : FLT_MAX,    format, flags);
    case ImGuiDataType_Double: return DragBehaviorT<double,double,double>(data_type, (double*)p_v, v_speed, p_min ? *(const double*)p_min : -DBL_MAX,   p_max ? *(const double*)p_max : DBL_MAX,    format, flags);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return false;
}